

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1497:7)>
::destroy(Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1497:7)>
          *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<int>_>_2 node;
  PromiseArenaMember *node_00;
  
  FiberBase::cancel(&this->super_FiberBase);
  if (((this->result).value.ptr.isSet == true) &&
     (node = (this->result).value.ptr.field_1,
     node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<int>_>_2)0x0)) {
    (this->result).value.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<int>_>_2)0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  node_00 = &((this->func).promise.super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node_00 != (PromiseArenaMember *)0x0) {
    (this->func).promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node_00);
  }
  FiberBase::~FiberBase(&this->super_FiberBase);
  return;
}

Assistant:

~Fiber() noexcept(false) { cancel(); }